

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_metal_shards(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int idam;
  OBJ_DATA *obj;
  char *txt;
  int to;
  
  obj = get_eq_char(ch,0x10);
  if (obj == (OBJ_DATA *)0x0) {
    txt = "You must be wielding a weapon to cast this spell.\n\r";
  }
  else {
    bVar1 = is_metal(obj);
    if (bVar1) {
      to = level / 10 + 1;
      iVar2 = number_range(level / 10 + -1,to);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      act("You wave your $p in a broad arc, sending a hail of razor-sharp metal at $N!",ch,obj,vo,3)
      ;
      act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at you!",ch,obj,vo,2);
      act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at $N!",ch,obj,vo,1);
      iVar2 = iVar2 + 1;
      while( true ) {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          return;
        }
        idam = dice(to,9);
        bVar1 = str_cmp(obj->material,"iron");
        if (((!bVar1) &&
            (bVar1 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                             _M_impl.super__Vector_impl_data._M_start[*(short *)((long)vo + 0x136)].
                             name,"elf"), !bVar1)) ||
           ((bVar1 = str_cmp(obj->material,"mithril"), !bVar1 &&
            (bVar1 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                             _M_impl.super__Vector_impl_data._M_start[*(short *)((long)vo + 0x136)].
                             name,"drow"), !bVar1)))) {
          idam = (int)((float)idam * 1.33);
        }
        damage_new(ch,(CHAR_DATA *)vo,idam,sn,2,true,false,0,1,"metal shard");
        bVar1 = is_safe_new(ch,(CHAR_DATA *)vo,false);
        if (bVar1) break;
        if (ch->in_room != *(ROOM_INDEX_DATA **)((long)vo + 0xa8)) {
          return;
        }
      }
      return;
    }
    txt = "You are not wielding a metallic weapon!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_metal_shards(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *weapon;
	int number, dam, i;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		send_to_char("You must be wielding a weapon to cast this spell.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You are not wielding a metallic weapon!\n\r", ch);
		return;
	}

	number = number_range(level / 10 - 1, level / 10 + 1);

	if (number <= 0)
		number = 1;

	act("You wave your $p in a broad arc, sending a hail of razor-sharp metal at $N!", ch, weapon, victim, TO_CHAR);
	act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at you!", ch, weapon, victim, TO_VICT);
	act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at $N!", ch, weapon, victim, TO_NOTVICT);

	for (i = 0; i < number; i++)
	{
		dam = dice(1 + level / 10, 9);

		if ((!str_cmp(weapon->material, "iron") && !str_cmp(race_table[victim->race].name, "elf"))
			|| (!str_cmp(weapon->material, "mithril") && !str_cmp(race_table[victim->race].name, "drow")))
		{
			dam = (int)((float)dam * 1.33);
		}

		damage_new(ch, victim, dam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "metal shard");

		if (is_safe_new(ch, victim, false))
			return;

		if (ch->in_room != victim->in_room)
			return;
	}
}